

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O2

OneofGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetOneofGeneratorInfo
          (Context *this,OneofDescriptor *oneof)

{
  second_type *psVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  OneofDescriptor *oneof_local;
  LogMessage local_48;
  
  oneof_local = oneof;
  psVar1 = FindOrNull<std::map<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>>
                     (&this->oneof_generator_info_map_,&oneof_local);
  if (psVar1 == (second_type *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
               ,0xba);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_48,"Can not find OneofGeneratorInfo for oneof: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)(oneof_local + 8));
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return psVar1;
}

Assistant:

const OneofGeneratorInfo* Context::GetOneofGeneratorInfo(
    const OneofDescriptor* oneof) const {
  const OneofGeneratorInfo* result =
      FindOrNull(oneof_generator_info_map_, oneof);
  if (result == NULL) {
    GOOGLE_LOG(FATAL) << "Can not find OneofGeneratorInfo for oneof: "
               << oneof->name();
  }
  return result;
}